

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O1

char * netaddr_to_prefixstring(netaddr_str *dst,netaddr *src,_Bool forceprefix)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  netaddr_str *__s;
  size_t sVar4;
  long lVar5;
  netaddr *pnVar6;
  long lVar7;
  byte bVar8;
  int __af;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (src == (netaddr *)0x0) goto LAB_00128f9b;
  bVar1 = src->_type;
  if (bVar1 < 0x2f) {
    if (bVar1 == 2) {
      bVar8 = 0x20;
    }
    else if (bVar1 == 10) {
      bVar8 = 0x80;
    }
    else {
LAB_00128e88:
      bVar8 = 0;
    }
  }
  else if (bVar1 == 0x2f) {
    bVar8 = 0x30;
  }
  else {
    if (bVar1 != 0x30) goto LAB_00128e88;
    bVar8 = 0x40;
  }
  if (bVar1 < 0x2f) {
    if (bVar1 == 2) {
      __af = 2;
    }
    else {
      if (bVar1 != 10) {
LAB_00128f9b:
        pcVar9 = strscpy(dst->buf,"-",0x3e);
        return pcVar9;
      }
      __af = 10;
    }
    __s = (netaddr_str *)inet_ntop(__af,src,dst->buf,0x3e);
  }
  else {
    if (bVar1 == 0x2f) {
      lVar7 = 0;
      pnVar6 = src;
      do {
        dst->buf[lVar7] = "0123456789abcdef"[pnVar6->_addr[0] >> 4];
        dst->buf[lVar7 + 1] = "0123456789abcdef"[pnVar6->_addr[0] & 0xf];
        dst->buf[lVar7 + 2] = ':';
        pnVar6 = (netaddr *)(pnVar6->_addr + 1);
        lVar7 = lVar7 + 3;
      } while (lVar7 != 0x12);
      lVar7 = 0x12;
    }
    else {
      if (bVar1 != 0x30) {
        if (bVar1 != 0x31) goto LAB_00128f9b;
        uVar3 = 0x3e;
        lVar7 = 0;
        pcVar9 = dst->buf;
        pnVar6 = src;
        do {
          __s = (netaddr_str *)0x0;
          if (uVar3 == 0) break;
          uVar2 = _uuid_from_string::max_group_len[lVar7];
          pcVar10 = pcVar9;
          if (2 < uVar3) {
            lVar5 = 0;
            uVar11 = uVar3;
            do {
              uVar11 = uVar11 - 2;
              *pcVar10 = "0123456789abcdef"[pnVar6->_addr[lVar5] >> 4];
              pcVar10[1] = "0123456789abcdef"[pnVar6->_addr[lVar5] & 0xf];
              pcVar10 = pcVar10 + 2;
              if ((uVar2 >> 1) - 1 == lVar5) break;
              lVar5 = lVar5 + 1;
            } while (2 < uVar11);
          }
          *pcVar10 = '\0';
          if (pcVar9 == (char *)0x0) break;
          pcVar9 = pcVar9 + uVar2;
          uVar3 = uVar3 - uVar2;
          if (lVar7 != 4) {
            *pcVar9 = '-';
            pcVar9 = pcVar9 + 1;
            uVar3 = uVar3 - 1;
          }
          pnVar6 = (netaddr *)(pnVar6->_addr + (uVar2 >> 1));
          lVar7 = lVar7 + 1;
          __s = dst;
        } while (lVar7 != 5);
        goto LAB_00129060;
      }
      lVar7 = 0;
      pnVar6 = src;
      do {
        dst->buf[lVar7] = "0123456789abcdef"[pnVar6->_addr[0] >> 4];
        dst->buf[lVar7 + 1] = "0123456789abcdef"[pnVar6->_addr[0] & 0xf];
        dst->buf[lVar7 + 2] = '-';
        pnVar6 = (netaddr *)(pnVar6->_addr + 1);
        lVar7 = lVar7 + 3;
      } while (lVar7 != 0x18);
    }
    dst->buf[lVar7 + -1] = '\0';
    __s = dst;
  }
LAB_00129060:
  if ((forceprefix) || (src->_prefix_len < bVar8)) {
    sVar4 = strlen(__s->buf);
    snprintf(dst->buf + sVar4,5,"/%d",(ulong)src->_prefix_len);
  }
  return __s->buf;
}

Assistant:

const char *
netaddr_to_prefixstring(struct netaddr_str *dst, const struct netaddr *src, bool forceprefix) {
  static const char *NONE = "-";
  const char *result = NULL;
  int maxprefix;

  if (!src) {
    return strscpy(dst->buf, NONE, sizeof(*dst));
  }

  maxprefix = netaddr_get_maxprefix(src);
  switch (src->_type) {
    case AF_INET:
      result = inet_ntop(AF_INET, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_INET6:
      result = inet_ntop(AF_INET6, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_MAC48:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 6, ':');
      break;
    case AF_EUI64:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 8, '-');
      break;
    case AF_UUID:
      result = _uuid_to_string(dst->buf, sizeof(*dst), src->_addr, 16);
      break;
    case AF_UNSPEC:
      /* fall through */
    default:
      return strscpy(dst->buf, NONE, sizeof(*dst));
  }
  if (forceprefix || src->_prefix_len < maxprefix) {
    /* append prefix */
    snprintf(dst->buf + strlen(result), 5, "/%d", src->_prefix_len);
  }
  return result;
}